

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

size_t __thiscall
axl::sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::insert
          (StringBase<short,_axl::sl::StringDetailsBase<short>_> *this,size_t index,C *p,
          size_t length)

{
  BufHdr *dst;
  long lVar1;
  C *dst_00;
  size_t sVar2;
  long lVar3;
  Ptr<void> shadow;
  Ptr<void> local_48;
  Ptr<void> local_38;
  
  sVar2 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length;
  if (length == 0xffffffffffffffff) {
    if (p == (C *)0x0) {
      return sVar2;
    }
    lVar3 = -2;
    do {
      lVar1 = lVar3 + 2;
      lVar3 = lVar3 + 2;
    } while (*(short *)((long)p + lVar1) != 0);
    length = lVar3 >> 1;
  }
  if (length != 0) {
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    dst = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr;
    if (((dst != (BufHdr *)0x0) && (dst + 1 <= p)) &&
       (p < (C *)((long)&dst[1].super_RefCount._vptr_RefCount + dst->m_bufferSize))) {
      local_48.m_p = (EVP_PKEY_CTX *)0x0;
      local_48.m_refCount = (RefCount *)0x0;
      rc::Ptr<void>::copy(&local_48,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)dst);
      rc::Ptr<void>::copy(&local_38,(EVP_PKEY_CTX *)local_48.m_p,(EVP_PKEY_CTX *)local_48.m_refCount
                         );
      rc::Ptr<void>::clear(&local_48);
    }
    dst_00 = insertSpace(this,index,length);
    if (dst_00 == (C *)0x0) {
      sVar2 = 0xffffffffffffffff;
    }
    else {
      __wrap_memcpy(dst_00,p,length * 2);
      sVar2 = sVar2 + length;
    }
    rc::Ptr<void>::clear(&local_38);
  }
  return sVar2;
}

Assistant:

size_t
	insert(
		size_t index,
		const C* p,
		size_t length = -1
	) {
		size_t oldLength = this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (length == 0)
			return oldLength;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		C* dst = insertSpace(index, length);
		if (!dst)
			return -1;

		Details::copy(dst, p, length);
		return oldLength + length;
	}